

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
* __thiscall
BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
::operator=(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
            *this,BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                  *other)

{
  if (this != other) {
    clear_tree(this);
    copy_tree(this,other);
    link_leaves(this,(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                      *)0x0);
  }
  return this;
}

Assistant:

BPlusTree<T>& BPlusTree<T>::operator=(const BPlusTree<T>& other) {
    if (this == &other)
        return *this;
    clear_tree();
    copy_tree(other);
    link_leaves();
    return *this;
}